

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall HighsMipSolverData::performRestart(HighsMipSolverData *this)

{
  HighsPostsolveStack *postsolveStack;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  HighsModelStatus HVar7;
  HighsMipSolver *pHVar8;
  pointer pHVar9;
  pointer pHVar10;
  pointer pHVar11;
  pointer piVar12;
  pointer pdVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_HighsMipSolverData_*,_false> this_01;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  uint uVar17;
  int numCuts;
  HighsInt presolve_reduction_limit;
  long lVar18;
  ulong uVar19;
  double from_lower_bound;
  undefined1 auVar20 [16];
  HighsPseudocostInitialization pscostinit;
  vector<double,_std::allocator<double>_> local_1d8;
  HighsBasis local_1b8;
  pointer local_158;
  pointer pHStack_150;
  HighsPseudocostInitialization local_140;
  
  paVar1 = &local_1b8.debug_origin_name.field_2;
  local_1b8.valid = false;
  local_1b8.alien = true;
  local_1b8.useful = false;
  local_1b8.was_alien = true;
  local_1b8.debug_id = -1;
  local_1b8.debug_update_count = -1;
  local_1b8.debug_origin_name.field_2._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_1b8.debug_origin_name._M_string_length = 4;
  local_1b8.debug_origin_name.field_2._M_local_buf[4] = '\0';
  local_1b8.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postsolveStack = &this->postSolveStack;
  local_1b8.debug_origin_name._M_dataplus._M_p = (pointer)paVar1;
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (&local_140,&this->pseudocost,
             (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_pscost_minreliable,
             postsolveStack);
  pHVar8 = this->mipsolver;
  pHVar8->pscostinit = &local_140;
  this->numRestarts = this->numRestarts + 1;
  uVar3 = this->num_nodes;
  uVar4 = this->num_leaves;
  auVar20._8_4_ = (int)uVar3;
  auVar20._0_8_ = uVar4;
  auVar20._12_4_ = (int)((ulong)uVar3 >> 0x20);
  this->num_leaves_before_run = uVar4;
  this->num_nodes_before_run = auVar20._8_8_;
  this->total_lp_iterations_before_run = this->total_lp_iterations;
  this->heuristic_lp_iterations_before_run = this->heuristic_lp_iterations;
  this->sepa_lp_iterations_before_run = this->sepa_lp_iterations;
  this->sb_lp_iterations_before_run = this->sb_lp_iterations;
  iVar5 = (this->lp).lpsolver.model_.lp_.num_row_;
  iVar6 = pHVar8->model_->num_row_;
  numCuts = iVar5 - iVar6;
  if (numCuts != 0 && iVar6 <= iVar5) {
    presolve::HighsPostsolveStack::appendCutsToModel(postsolveStack,numCuts);
  }
  pHVar9 = (this->presolvedModel).integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_158 = (this->presolvedModel).integrality_.
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pHStack_150 = (this->presolvedModel).integrality_.
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar2 = (this->presolvedModel).offset_;
  HighsLp::operator=(&this->presolvedModel,&(this->lp).lpsolver.model_.lp_);
  (this->presolvedModel).offset_ = dVar2;
  pHVar10 = (this->presolvedModel).integrality_.
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_start = pHVar9;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_158;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pHStack_150;
  if (pHVar10 != (pointer)0x0) {
    operator_delete(pHVar10);
  }
  if ((this->firstrootbasis).valid == true) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&local_1b8.col_status,(long)(this->postSolveStack).origNumCol);
    local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_1d8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,1);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&local_1b8.row_status,(long)(this->postSolveStack).origNumRow,
               (value_type *)&local_1d8);
    uVar14 = local_1b8._0_8_;
    local_1b8.valid = true;
    uVar15 = local_1b8._0_8_;
    local_1b8._3_5_ = SUB85(uVar14,3);
    local_1b8._0_2_ = SUB82(uVar15,0);
    local_1b8.useful = true;
    pHVar8 = this->mipsolver;
    lVar16 = (long)pHVar8->model_->num_col_;
    if (0 < lVar16) {
      pHVar11 = (this->firstrootbasis).col_status.
                super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        local_1b8.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
        ._M_impl.super__Vector_impl_data._M_start[piVar12[lVar18]] = pHVar11[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar16 != lVar18);
    }
    pHVar11 = (this->firstrootbasis).row_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = (int)(this->firstrootbasis).row_status.
                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_finish - (int)pHVar11;
    if (0 < (int)uVar17) {
      piVar12 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        local_1b8.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
        ._M_impl.super__Vector_impl_data._M_start[piVar12[uVar19]] = pHVar11[uVar19];
        uVar19 = uVar19 + 1;
      } while ((uVar17 & 0x7fffffff) != uVar19);
    }
    pHVar8->rootbasis = &local_1b8;
  }
  dVar2 = this->mipsolver->model_->offset_;
  this->upper_limit = this->upper_limit + dVar2;
  this->optimality_limit = this->optimality_limit + dVar2;
  this->lower_bound = this->lower_bound + dVar2;
  this->upper_bound = this->upper_bound + dVar2;
  pdVar13 = (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar13) {
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar13;
  }
  (this->pruned_treeweight).hi = 0.0;
  (this->pruned_treeweight).lo = 0.0;
  HighsNodeQueue::clear(&this->nodequeue);
  this_00 = (this->globalOrbits).
            super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->globalOrbits).super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->globalOrbits).super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar5 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).restart_presolve_reduction_limit
  ;
  presolve_reduction_limit = -1;
  if (-1 < iVar5) {
    presolve_reduction_limit =
         (int)((ulong)((long)(this->postSolveStack).reductions.
                             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->postSolveStack).reductions.
                            super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + iVar5;
  }
  runPresolve(this,presolve_reduction_limit);
  pHVar8 = this->mipsolver;
  HVar7 = pHVar8->modelstatus_;
  if (HVar7 == kMin) {
    runSetup(this);
    presolve::HighsPostsolveStack::removeCutsFromModel(postsolveStack,numCuts);
    pHVar8 = this->mipsolver;
    if (pHVar8->rootbasis == &local_1b8) {
      pHVar8->rootbasis = (HighsBasis *)0x0;
    }
    pHVar8->pscostinit = (HighsPseudocostInitialization *)0x0;
  }
  else {
    dVar2 = pHVar8->model_->offset_;
    this->upper_limit = this->upper_limit - dVar2;
    this->optimality_limit = this->optimality_limit - dVar2;
    if (HVar7 == kOptimal) {
      this_01._M_head_impl =
           (pHVar8->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      (this_01._M_head_impl)->upper_bound = 0.0;
      local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      transformNewIntegerFeasibleSolution(this_01._M_head_impl,&local_1d8,true);
      if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      this->upper_bound = this->upper_bound - dVar2;
    }
    from_lower_bound = this->lower_bound - this->mipsolver->model_->offset_;
    dVar2 = this->upper_bound;
    this->lower_bound = dVar2;
    if (this->mipsolver->submip == false) {
      if ((dVar2 != from_lower_bound) || (NAN(dVar2) || NAN(from_lower_bound))) {
        updatePrimalDualIntegral(this,from_lower_bound,dVar2,dVar2,dVar2,false,false);
      }
    }
    pHVar8 = this->mipsolver;
    if ((pHVar8->solution_objective_ < INFINITY) && (pHVar8->modelstatus_ == kInfeasible)) {
      pHVar8->modelstatus_ = kOptimal;
    }
  }
  HighsPseudocostInitialization::~HighsPseudocostInitialization(&local_140);
  if (local_1b8.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.row_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1b8.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.col_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.debug_origin_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8.debug_origin_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HighsMipSolverData::performRestart() {
  HighsBasis root_basis;
  HighsPseudocostInitialization pscostinit(
      pseudocost, mipsolver.options_mip_->mip_pscost_minreliable,
      postSolveStack);

  mipsolver.pscostinit = &pscostinit;
  ++numRestarts;
  num_leaves_before_run = num_leaves;
  num_nodes_before_run = num_nodes;
  num_nodes_before_run = num_nodes;
  total_lp_iterations_before_run = total_lp_iterations;
  heuristic_lp_iterations_before_run = heuristic_lp_iterations;
  sepa_lp_iterations_before_run = sepa_lp_iterations;
  sb_lp_iterations_before_run = sb_lp_iterations;
  HighsInt numLpRows = lp.getLp().num_row_;
  HighsInt numModelRows = mipsolver.numRow();
  HighsInt numCuts = numLpRows - numModelRows;
  if (numCuts > 0) postSolveStack.appendCutsToModel(numCuts);
  auto integrality = std::move(presolvedModel.integrality_);
  double offset = presolvedModel.offset_;
  presolvedModel = lp.getLp();
  presolvedModel.offset_ = offset;
  presolvedModel.integrality_ = std::move(integrality);

  const HighsBasis& basis = firstrootbasis;
  if (basis.valid) {
    // if we have a basis after solving the root LP, we expand it to the
    // original space so that it can be used for constructing a starting basis
    // for the presolved model after the restart
    root_basis.col_status.resize(postSolveStack.getOrigNumCol());
    root_basis.row_status.resize(postSolveStack.getOrigNumRow(),
                                 HighsBasisStatus::kBasic);
    root_basis.valid = true;
    root_basis.useful = true;

    for (HighsInt i = 0; i < mipsolver.model_->num_col_; ++i)
      root_basis.col_status[postSolveStack.getOrigColIndex(i)] =
          basis.col_status[i];

    HighsInt numRow = basis.row_status.size();
    for (HighsInt i = 0; i < numRow; ++i)
      root_basis.row_status[postSolveStack.getOrigRowIndex(i)] =
          basis.row_status[i];

    mipsolver.rootbasis = &root_basis;
  }

  // Transform the reference of the objective limit and lower/upper
  // bounds to the original model, since offset will generally change
  // in presolve. Bound changes are transitory, so no real gap change,
  // and no update to P-D integral is necessary
  upper_limit += mipsolver.model_->offset_;
  optimality_limit += mipsolver.model_->offset_;

  upper_bound += mipsolver.model_->offset_;
  lower_bound += mipsolver.model_->offset_;

  // remove the current incumbent. Any incumbent is already transformed into the
  // original space and kept there
  incumbent.clear();
  pruned_treeweight = 0;
  nodequeue.clear();
  globalOrbits.reset();

  // Need to be able to set presolve reduction limit separately when
  // restarting - so that bugs in presolve restart can be investigated
  // independently (see #1553)
  //
  // However, when restarting, presolve is (naturally) applied to the
  // presolved problem, so have to control the number of _further_
  // presolve reductions
  //
  // The number of further presolve reductions must be positive,
  // otherwise the MIP solver cycles, hence
  // restart_presolve_reduction_limit cannot be zero
  //
  // Although postSolveStack.numReductions() is size_t, it makes no
  // sense to use presolve_reduction_limit when the number of
  // reductions is vast
  HighsInt num_reductions = HighsInt(postSolveStack.numReductions());
  HighsInt restart_presolve_reduction_limit =
      mipsolver.options_mip_->restart_presolve_reduction_limit;
  assert(restart_presolve_reduction_limit);
  HighsInt further_presolve_reduction_limit =
      restart_presolve_reduction_limit >= 0
          ? num_reductions + restart_presolve_reduction_limit
          : -1;
  runPresolve(further_presolve_reduction_limit);

  if (mipsolver.modelstatus_ != HighsModelStatus::kNotset) {
    // transform the objective limit to the current model
    upper_limit -= mipsolver.model_->offset_;
    optimality_limit -= mipsolver.model_->offset_;

    if (mipsolver.modelstatus_ == HighsModelStatus::kOptimal) {
      mipsolver.mipdata_->upper_bound = 0;
      mipsolver.mipdata_->transformNewIntegerFeasibleSolution(
          std::vector<double>());
    } else {
      upper_bound -= mipsolver.model_->offset_;
    }

    // lower_bound still relates to the original model, and the offset
    // is never applied, since MIP solving is complete, and
    // lower_bound is set to upper_bound, so apply the offset now, so
    // that housekeeping in updatePrimalDualIntegral is correct
    double prev_lower_bound = lower_bound - mipsolver.model_->offset_;

    lower_bound = upper_bound;

    // There must be a gap change, since it's now zero, so always call
    // updatePrimalDualIntegral (unless solving a sub-MIP)
    //
    // Surely there must be a lower bound change
    bool bound_change = lower_bound != prev_lower_bound;
    assert(bound_change);
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);
    if (mipsolver.solution_objective_ != kHighsInf &&
        mipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
      mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }
  // Bounds are currently in the original space since presolve will have
  // changed offset_
  runSetup();

  postSolveStack.removeCutsFromModel(numCuts);

  // HighsNodeQueue oldNodeQueue;
  // std::swap(nodequeue, oldNodeQueue);

  // remove the pointer into the stack-space of this function
  if (mipsolver.rootbasis == &root_basis) mipsolver.rootbasis = nullptr;
  mipsolver.pscostinit = nullptr;
}